

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void integer_suite::test_zero_white(void)

{
  char input [6];
  decoder_type decoder;
  undefined4 local_16c;
  long local_168;
  value_type local_160 [8];
  basic_decoder<char> local_158;
  
  local_158.input.tail = local_160 + 5;
  builtin_memcpy(local_160,"  0  ",6);
  local_158.input.head = local_160;
  memset(&local_158.current,0,0x120);
  local_158.current.code = uninitialized;
  local_158.current.view.head = (const_pointer)0x0;
  local_158.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_158);
  local_168 = CONCAT44(local_168._4_4_,local_158.current.code);
  local_16c = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x196,"void integer_suite::test_zero_white()",&local_168,&local_16c);
  local_168 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long>(&local_158);
  local_16c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("decoder.signed_value<std::int64_t>()","0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x197,"void integer_suite::test_zero_white()",&local_168,&local_16c);
  if (error_unexpected_token < local_158.current.code) {
    if (local_158.current.code == end) {
      local_158.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_158);
    }
  }
  local_168 = CONCAT44(local_168._4_4_,local_158.current.code);
  local_16c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x199,"void integer_suite::test_zero_white()",&local_168,&local_16c);
  return;
}

Assistant:

void api_signed()
{
    const char input[] = "42";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<int>(), 42);
}